

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

uint64_t rapidjson::internal::BigInteger::ParseUint64(char *begin,char *end)

{
  uint64_t uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (begin == end) {
      return uVar1;
    }
    if (9 < (byte)(*begin - 0x30U)) break;
    uVar1 = (ulong)(byte)(*begin - 0x30U) + uVar1 * 10;
    begin = begin + 1;
  }
  __assert_fail("*p >= \'0\' && *p <= \'9\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                ,0xf2,
                "static uint64_t rapidjson::internal::BigInteger::ParseUint64(const char *, const char *)"
               );
}

Assistant:

static uint64_t ParseUint64(const char* begin, const char* end) {
        uint64_t r = 0;
        for (const char* p = begin; p != end; ++p) {
            RAPIDJSON_ASSERT(*p >= '0' && *p <= '9');
            r = r * 10u + static_cast<unsigned>(*p - '0');
        }
        return r;
    }